

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O3

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  uint uVar4;
  _func_int **pp_Var5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  undefined1 auVar9 [16];
  int iVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  int iVar13;
  float *pfVar14;
  _func_int *p_Var15;
  float fVar16;
  undefined1 auVar17 [16];
  
  uVar4 = bottom_top_blob->c;
  iVar10 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar4) {
      pp_Var5 = this->_vptr_Clip_x86;
      uVar11 = 0;
      do {
        if (0 < iVar10) {
          uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var5[-3]);
          uVar2 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var5[-3]);
          pauVar12 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar13 = iVar10;
          do {
            auVar17._4_4_ = uVar1;
            auVar17._0_4_ = uVar1;
            auVar17._8_4_ = uVar1;
            auVar17._12_4_ = uVar1;
            auVar17 = maxps(*pauVar12,auVar17);
            auVar9._4_4_ = uVar2;
            auVar9._0_4_ = uVar2;
            auVar9._8_4_ = uVar2;
            auVar9._12_4_ = uVar2;
            auVar17 = minps(auVar17,auVar9);
            *pauVar12 = auVar17;
            pauVar12 = pauVar12 + 1;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar4);
    }
  }
  else if (0 < (int)uVar4) {
    sVar6 = bottom_top_blob->cstep;
    sVar7 = bottom_top_blob->elemsize;
    pvVar8 = bottom_top_blob->data;
    pp_Var5 = this->_vptr_Clip_x86;
    uVar11 = 0;
    do {
      if (0 < iVar10) {
        pfVar14 = (float *)(sVar6 * sVar7 * uVar11 + (long)pvVar8);
        iVar13 = iVar10 + 1;
        do {
          p_Var15 = pp_Var5[-3];
          fVar3 = *(float *)(&this->field_0xd0 + (long)p_Var15);
          fVar16 = *pfVar14;
          if (*pfVar14 < fVar3) {
            *pfVar14 = fVar3;
            p_Var15 = pp_Var5[-3];
            fVar16 = fVar3;
          }
          if (*(float *)(&this->field_0xd4 + (long)p_Var15) < fVar16) {
            *pfVar14 = *(float *)(&this->field_0xd4 + (long)p_Var15);
          }
          pfVar14 = pfVar14 + 1;
          iVar13 = iVar13 + -1;
        } while (1 < iVar13);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar4);
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _max = _mm256_set1_ps(max);
            __m256 _min = _mm256_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m256 _ptr = _mm256_loadu_ps(ptr);
                _ptr = _mm256_max_ps(_ptr, _min);
                _ptr = _mm256_min_ps(_ptr, _max);
                _mm256_storeu_ps(ptr, _ptr);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _max = _mm_set1_ps(max);
            __m128 _min = _mm_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m128 _ptr = _mm_loadu_ps(ptr);
                _ptr = _mm_max_ps(_ptr, _min);
                _ptr = _mm_min_ps(_ptr, _max);
                _mm_storeu_ps(ptr, _ptr);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int remain = size;
        for (; remain > 0; remain--)
        {
            if (*ptr < min)
                *ptr = min;

            if (*ptr > max)
                *ptr = max;

            ptr++;
        }
    }

    return 0;
}